

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::ItemSimilarityRecommender
          (ItemSimilarityRecommender *this,ItemSimilarityRecommender *from)

{
  InternalMetadata *this_00;
  StringVector *from_00;
  Int64Vector *from_01;
  StringVector *this_01;
  Int64Vector *this_02;
  undefined8 *puVar1;
  ulong uVar2;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ItemSimilarityRecommender_004be018;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,
             &(from->itemitemsimilarities_).super_RepeatedPtrFieldBase);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (this_00,(string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  (this->iteminputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->iteminputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->iteminputfeaturename_,uVar2,puVar1);
  }
  (this->numrecommendationsinputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->numrecommendationsinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->numrecommendationsinputfeaturename_,uVar2,puVar1);
  }
  (this->itemrestrictioninputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->itemrestrictioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->itemrestrictioninputfeaturename_,uVar2,puVar1);
  }
  (this->itemexclusioninputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->itemexclusioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->itemexclusioninputfeaturename_,uVar2,puVar1);
  }
  (this->recommendeditemlistoutputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->recommendeditemlistoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
  ;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->recommendeditemlistoutputfeaturename_,uVar2,puVar1);
  }
  (this->recommendeditemscoreoutputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (ulong)(from->recommendeditemscoreoutputfeaturename_).tagged_ptr_.ptr_ &
          0xfffffffffffffffe;
  if (*(long *)(uVar2 + 8) != 0) {
    puVar1 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar1 = (undefined8 *)*puVar1;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->recommendeditemscoreoutputfeaturename_,uVar2,puVar1);
  }
  from_00 = from->itemstringids_;
  if (from_00 == (StringVector *)0x0 ||
      from == (ItemSimilarityRecommender *)_ItemSimilarityRecommender_default_instance_) {
    this_01 = (StringVector *)0x0;
  }
  else {
    this_01 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_01,from_00);
  }
  this->itemstringids_ = this_01;
  from_01 = from->itemint64ids_;
  if (from_01 == (Int64Vector *)0x0 ||
      from == (ItemSimilarityRecommender *)_ItemSimilarityRecommender_default_instance_) {
    this_02 = (Int64Vector *)0x0;
  }
  else {
    this_02 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_02,from_01);
  }
  this->itemint64ids_ = this_02;
  return;
}

Assistant:

ItemSimilarityRecommender::ItemSimilarityRecommender(const ItemSimilarityRecommender& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      itemitemsimilarities_(from.itemitemsimilarities_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  iteminputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    iteminputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_iteminputfeaturename().empty()) {
    iteminputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_iteminputfeaturename(), 
      GetArenaForAllocation());
  }
  numrecommendationsinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    numrecommendationsinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_numrecommendationsinputfeaturename().empty()) {
    numrecommendationsinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_numrecommendationsinputfeaturename(), 
      GetArenaForAllocation());
  }
  itemrestrictioninputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    itemrestrictioninputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_itemrestrictioninputfeaturename().empty()) {
    itemrestrictioninputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_itemrestrictioninputfeaturename(), 
      GetArenaForAllocation());
  }
  itemexclusioninputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    itemexclusioninputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_itemexclusioninputfeaturename().empty()) {
    itemexclusioninputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_itemexclusioninputfeaturename(), 
      GetArenaForAllocation());
  }
  recommendeditemlistoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    recommendeditemlistoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_recommendeditemlistoutputfeaturename().empty()) {
    recommendeditemlistoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_recommendeditemlistoutputfeaturename(), 
      GetArenaForAllocation());
  }
  recommendeditemscoreoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    recommendeditemscoreoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_recommendeditemscoreoutputfeaturename().empty()) {
    recommendeditemscoreoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_recommendeditemscoreoutputfeaturename(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_itemstringids()) {
    itemstringids_ = new ::CoreML::Specification::StringVector(*from.itemstringids_);
  } else {
    itemstringids_ = nullptr;
  }
  if (from._internal_has_itemint64ids()) {
    itemint64ids_ = new ::CoreML::Specification::Int64Vector(*from.itemint64ids_);
  } else {
    itemint64ids_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ItemSimilarityRecommender)
}